

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceObjectArchive::AppendDeviceData
          (DeviceObjectArchive *this,DeviceObjectArchive *Src,DeviceType Dev)

{
  bool bVar1;
  IMemoryAllocator *Allocator_00;
  reference __x;
  reference this_00;
  pointer pvVar2;
  const_reference this_01;
  reference this_02;
  SerializedData local_f8;
  reference local_d8;
  SerializedData *SrcShader;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  value_type *__range1_1;
  value_type *DstShaders;
  value_type *SrcShaders;
  const_reference local_88;
  value_type *SrcData;
  _Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
  local_78;
  const_iterator src_res_it;
  value_type *DstData;
  pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>
  *dst_res_it;
  iterator __end1;
  iterator __begin1;
  unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>
  *__range1;
  IMemoryAllocator *Allocator;
  DeviceType Dev_local;
  DeviceObjectArchive *Src_local;
  DeviceObjectArchive *this_local;
  
  Allocator_00 = GetRawAllocator();
  __end1 = std::
           unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>
           ::begin(&this->m_NamedResources);
  dst_res_it = (pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>
                *)std::
                  unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>
                  ::end(&this->m_NamedResources);
  while (bVar1 = std::__detail::operator!=
                           (&__end1.
                             super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                            ,(_Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                              *)&dst_res_it), bVar1) {
    __x = std::__detail::
          _Node_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false,_false>
          ::operator*(&__end1);
    this_00 = std::array<Diligent::SerializedData,_7UL>::operator[]
                        (&(__x->second).DeviceSpecific,(ulong)Dev);
    SerializedData::SerializedData((SerializedData *)&src_res_it);
    SerializedData::operator=(this_00,(SerializedData *)&src_res_it);
    SerializedData::~SerializedData((SerializedData *)&src_res_it);
    local_78._M_cur =
         (__node_type *)
         std::
         unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>
         ::find(&Src->m_NamedResources,&__x->first);
    SrcData = (value_type *)
              std::
              unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>
              ::end(&Src->m_NamedResources);
    bVar1 = std::__detail::operator==
                      (&local_78,
                       (_Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                        *)&SrcData);
    if (!bVar1) {
      pvVar2 = std::__detail::
               _Node_const_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false,_false>
               ::operator->((_Node_const_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false,_false>
                             *)&local_78);
      local_88 = std::array<Diligent::SerializedData,_7UL>::operator[]
                           (&(pvVar2->second).DeviceSpecific,(ulong)Dev);
      SerializedData::MakeCopy((SerializedData *)&SrcShaders,local_88,Allocator_00);
      SerializedData::operator=(this_00,(SerializedData *)&SrcShaders);
      SerializedData::~SerializedData((SerializedData *)&SrcShaders);
    }
    std::__detail::
    _Node_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false,_false>
    ::operator++(&__end1);
  }
  this_01 = std::
            array<std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>,_7UL>
            ::operator[](&Src->m_DeviceShaders,(ulong)Dev);
  this_02 = std::
            array<std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>,_7UL>
            ::operator[](&this->m_DeviceShaders,(ulong)Dev);
  std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::clear(this_02);
  __end1_1 = std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::begin
                       (this_01);
  SrcShader = (SerializedData *)
              std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::end
                        (this_01);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_Diligent::SerializedData_*,_std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>_>
                             *)&SrcShader), bVar1) {
    local_d8 = __gnu_cxx::
               __normal_iterator<const_Diligent::SerializedData_*,_std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>_>
               ::operator*(&__end1_1);
    SerializedData::MakeCopy(&local_f8,local_d8,Allocator_00);
    std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::
    emplace_back<Diligent::SerializedData>(this_02,&local_f8);
    SerializedData::~SerializedData(&local_f8);
    __gnu_cxx::
    __normal_iterator<const_Diligent::SerializedData_*,_std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>_>
    ::operator++(&__end1_1);
  }
  return;
}

Assistant:

void DeviceObjectArchive::AppendDeviceData(const DeviceObjectArchive& Src, DeviceType Dev) noexcept(false)
{
    auto& Allocator = GetRawAllocator();
    for (auto& dst_res_it : m_NamedResources)
    {
        auto& DstData = dst_res_it.second.DeviceSpecific[static_cast<size_t>(Dev)];
        // Clear dst device data to make sure we don't have invalid shader indices
        DstData = {};

        auto src_res_it = Src.m_NamedResources.find(dst_res_it.first);
        if (src_res_it == Src.m_NamedResources.end())
            continue;

        const auto& SrcData{src_res_it->second.DeviceSpecific[static_cast<size_t>(Dev)]};
        // Always copy src data even if it is empty
        DstData = SrcData.MakeCopy(Allocator);
    }

    // Copy all shaders to make sure PSO shader indices are correct
    const auto& SrcShaders = Src.m_DeviceShaders[static_cast<size_t>(Dev)];
    auto&       DstShaders = m_DeviceShaders[static_cast<size_t>(Dev)];
    DstShaders.clear();
    for (const auto& SrcShader : SrcShaders)
        DstShaders.emplace_back(SrcShader.MakeCopy(Allocator));
}